

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiContext *g;
  ulong uVar3;
  long v_00;
  longlong v_01;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  float fVar13;
  float logarithmic_zero_epsilon;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar1 = GImGui;
  uVar7 = flags & 0x100000;
  uVar6 = data_type & 0xfffffffe;
  uVar3 = v_min - v_max;
  uVar4 = -uVar3;
  if (0 < (long)uVar3) {
    uVar4 = uVar3;
  }
  fVar18 = *(float *)((long)&(bb->Min).x + (ulong)(uVar7 >> 0x12));
  fVar16 = *(float *)((long)&(bb->Max).x + (ulong)(uVar7 >> 0x12));
  fVar14 = (fVar16 - fVar18) + -4.0;
  fVar17 = (GImGui->Style).GrabMinSize;
  if (uVar6 != 8) {
    fVar13 = fVar14 / (float)(long)(uVar4 + 1);
    uVar8 = -(uint)(fVar17 <= fVar13);
    fVar17 = (float)(~uVar8 & (uint)fVar17 | (uint)fVar13 & uVar8);
  }
  if (fVar14 <= fVar17) {
    fVar17 = fVar14;
  }
  fVar19 = fVar14 - fVar17;
  fVar9 = -fVar17;
  fVar13 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar6 == 8) {
      iVar2 = ImParseFormatPrecision(format,3);
      fVar13 = (float)iVar2;
    }
    else {
      fVar13 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar13);
    fVar13 = fVar19;
    if (fVar19 <= 1.0) {
      fVar13 = 1.0;
    }
    fVar13 = ((pIVar1->Style).LogSliderDeadzone * 0.5) / fVar13;
  }
  fVar18 = fVar18 + 2.0 + fVar17 * 0.5;
  fVar16 = (fVar16 + -2.0) - fVar17 * 0.5;
  if (pIVar1->ActiveId == id) {
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar1->ActiveIdIsJustActivated == true) {
        pIVar1->SliderCurrentAccum = 0.0;
        pIVar1->SliderCurrentAccumDirty = false;
      }
      IVar12 = GetNavInputAmount2d(6,ImGuiNavReadMode_RepeatFast,0.0,0.0);
      fVar19 = IVar12.x;
      if (uVar7 != 0) {
        fVar19 = -IVar12.y;
      }
      if ((fVar19 != 0.0) || (NAN(fVar19))) {
        if ((uVar6 == 8) && (iVar2 = ImParseFormatPrecision(format,3), 0 < iVar2)) {
          fVar19 = fVar19 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar19 = fVar19 / 10.0;
          }
        }
        else if ((uVar4 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar19 = *(float *)(&DAT_001a83d0 + (ulong)(fVar19 < 0.0) * 4) / (float)(long)uVar4;
        }
        else {
          fVar19 = fVar19 / 100.0;
        }
        uVar8 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar19 = (float)(~uVar8 & (uint)fVar19 | (uint)(fVar19 * 10.0) & uVar8) +
                 pIVar1->SliderCurrentAccum;
        pIVar1->SliderCurrentAccum = fVar19;
        pIVar1->SliderCurrentAccumDirty = true;
      }
      else {
        fVar19 = pIVar1->SliderCurrentAccum;
      }
      if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar1->SliderCurrentAccumDirty == true) {
        bVar5 = SUB41((flags & 0x20U) >> 5,0);
        fVar11 = ScaleRatioFromValueT<long_long,long_long,double>
                           (data_type,*v,v_min,v_max,bVar5,logarithmic_zero_epsilon,fVar13);
        if (((1.0 <= fVar11) && (0.0 < fVar19)) || ((fVar11 <= 0.0 && (fVar19 < 0.0)))) {
          pIVar1->SliderCurrentAccum = 0.0;
          pIVar1->SliderCurrentAccumDirty = false;
          bVar5 = false;
          goto LAB_0018ee13;
        }
        fVar15 = fVar19 + fVar11;
        fVar10 = 1.0;
        if (fVar15 <= 1.0) {
          fVar10 = fVar15;
        }
        fVar10 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar10);
        v_01 = ScaleValueFromRatioT<long_long,long_long,double>
                         (data_type,fVar10,v_min,v_max,bVar5,logarithmic_zero_epsilon,fVar13);
        if (uVar6 == 8 && (flags & 0x40U) == 0) {
          v_01 = RoundScalarWithFormatT<long_long>(format,data_type,v_01);
        }
        fVar15 = ScaleRatioFromValueT<long_long,long_long,double>
                           (data_type,v_01,v_min,v_max,bVar5,logarithmic_zero_epsilon,fVar13);
        fVar15 = fVar15 - fVar11;
        bVar5 = fVar19 <= fVar15;
        if (0.0 < fVar19) {
          bVar5 = fVar15 < fVar19;
        }
        if (!bVar5) {
          fVar15 = fVar19;
        }
        pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar15;
        pIVar1->SliderCurrentAccumDirty = false;
        goto LAB_0018ec93;
      }
      bVar5 = false;
      goto LAB_0018ee13;
    }
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar1->IO).MouseDown[0] != false) {
        fVar11 = *(float *)((pIVar1->IO).MouseDown + (ulong)(uVar7 >> 0x14) * 4 + -8);
        if (pIVar1->ActiveIdIsJustActivated == true) {
          fVar10 = ScaleRatioFromValueT<long_long,long_long,double>
                             (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                              logarithmic_zero_epsilon,fVar13);
          if (uVar7 != 0) {
            fVar10 = 1.0 - fVar10;
          }
          fVar10 = (fVar16 - fVar18) * fVar10 + fVar18;
          fVar15 = 0.0;
          if (fVar11 <= fVar17 * 0.5 + fVar10 + 1.0 && fVar9 * 0.5 + fVar10 + -1.0 <= fVar11) {
            fVar15 = fVar11 - fVar10;
          }
          fVar10 = 0.0;
          if (uVar6 == 8) {
            fVar10 = fVar15;
          }
          pIVar1->SliderGrabClickOffset = fVar10;
        }
        fVar10 = 0.0;
        if (0.0 < fVar19) {
          fVar19 = ((fVar11 - pIVar1->SliderGrabClickOffset) - fVar18) / fVar19;
          fVar10 = 1.0;
          if (fVar19 <= 1.0) {
            fVar10 = fVar19;
          }
          fVar10 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar10);
        }
        if (uVar7 != 0) {
          fVar10 = 1.0 - fVar10;
        }
LAB_0018ec93:
        v_00 = ScaleValueFromRatioT<long_long,long_long,double>
                         (data_type,fVar10,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                          logarithmic_zero_epsilon,fVar13);
        if (uVar6 == 8 && (flags & 0x40U) == 0) {
          v_00 = RoundScalarWithFormatT<long_long>(format,data_type,v_00);
        }
        if (*v == v_00) {
          bVar5 = false;
        }
        else {
          *v = v_00;
          bVar5 = true;
        }
        goto LAB_0018ee13;
      }
      ClearActiveID();
    }
  }
  bVar5 = false;
LAB_0018ee13:
  if (1.0 <= fVar14) {
    fVar14 = ScaleRatioFromValueT<long_long,long_long,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar13);
    if (uVar7 != 0) {
      fVar14 = 1.0 - fVar14;
    }
    fVar18 = (fVar16 - fVar18) * fVar14 + fVar18;
    if (uVar7 != 0) {
      fVar16 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = fVar9 * 0.5 + fVar18;
      (out_grab_bb->Max).x = fVar16 + -2.0;
      (out_grab_bb->Max).y = fVar17 * 0.5 + fVar18;
    }
    else {
      fVar16 = (bb->Min).y;
      fVar14 = (bb->Max).y;
      (out_grab_bb->Min).x = fVar9 * 0.5 + fVar18;
      (out_grab_bb->Min).y = fVar16 + 2.0;
      (out_grab_bb->Max).x = fVar17 * 0.5 + fVar18;
      (out_grab_bb->Max).y = fVar14 + -2.0;
    }
  }
  else {
    IVar12 = bb->Min;
    out_grab_bb->Min = IVar12;
    out_grab_bb->Max = IVar12;
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiNavReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}